

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall duckdb::MainHeader::Write(MainHeader *this,WriteStream *ser)

{
  char *pcVar1;
  idx_t i;
  long lVar2;
  allocator local_49;
  string local_48;
  
  (**ser->_vptr_WriteStream)(ser,&MAGIC_BYTES,4);
  local_48._M_dataplus._M_p = (pointer)this->version_number;
  (**ser->_vptr_WriteStream)(ser,&local_48,8);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    local_48._M_dataplus._M_p = (pointer)this->flags[lVar2];
    (**ser->_vptr_WriteStream)(ser,&local_48,8);
  }
  pcVar1 = DuckDB::LibraryVersion();
  ::std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  SerializeVersionNumber(ser,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  pcVar1 = DuckDB::SourceID();
  ::std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  SerializeVersionNumber(ser,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void MainHeader::Write(WriteStream &ser) {
	ser.WriteData(const_data_ptr_cast(MAGIC_BYTES), MAGIC_BYTE_SIZE);
	ser.Write<uint64_t>(version_number);
	for (idx_t i = 0; i < FLAG_COUNT; i++) {
		ser.Write<uint64_t>(flags[i]);
	}
	SerializeVersionNumber(ser, DuckDB::LibraryVersion());
	SerializeVersionNumber(ser, DuckDB::SourceID());
}